

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O0

int nni_listener_init(nni_listener *l,nni_sock *s,nni_sp_tran *tran)

{
  void *lp;
  int rv;
  nni_sp_tran *tran_local;
  nni_sock *s_local;
  nni_listener *l_local;
  
  l->l_closed = false;
  l->l_data = (void *)0x0;
  l->l_ref = 1;
  l->l_sock = s;
  l->l_tran = tran;
  nni_atomic_flag_reset(&l->l_started);
  memcpy(l,tran->tran_listener,0x68);
  (l->l_node).ln_next = (nni_list_node *)0x0;
  (l->l_node).ln_prev = (nni_list_node *)0x0;
  nni_list_init_offset(&l->l_pipes,0xa8);
  nni_aio_init(&l->l_acc_aio,listener_accept_cb,l);
  nni_aio_init(&l->l_tmo_aio,listener_timer_cb,l);
  listener_stats_init(l);
  l->l_data = l + 1;
  lp._4_4_ = (*(l->l_ops).l_init)(l->l_data,&l->l_url,l);
  if (lp._4_4_ == 0) {
    lp._4_4_ = nni_sock_add_listener(s,l);
  }
  if (lp._4_4_ == 0) {
    nni_mtx_lock(&listeners_lk);
    lp._4_4_ = nni_id_alloc32(&listeners,&l->l_id,l);
    nni_mtx_unlock(&listeners_lk);
  }
  if (lp._4_4_ == 0) {
    listener_register_stats(l);
  }
  return lp._4_4_;
}

Assistant:

static int
nni_listener_init(nni_listener *l, nni_sock *s, nni_sp_tran *tran)
{
	int   rv;
	void *lp;

	l->l_closed = false;
	l->l_data   = NULL;
	l->l_ref    = 1;
	l->l_sock   = s;
	l->l_tran   = tran;
	nni_atomic_flag_reset(&l->l_started);

	// Make a copy of the endpoint operations.  This allows us to
	// modify them (to override NULLs for example), and avoids an extra
	// dereference on hot paths.
	l->l_ops = *tran->tran_listener;

	NNI_LIST_NODE_INIT(&l->l_node);
	NNI_LIST_INIT(&l->l_pipes, nni_pipe, p_ep_node);

	nni_aio_init(&l->l_acc_aio, listener_accept_cb, l);
	nni_aio_init(&l->l_tmo_aio, listener_timer_cb, l);

	listener_stats_init(l);

	l->l_data = ((uint8_t *) l) + NNI_ALIGN_UP(sizeof(*l));
	lp        = l->l_data;

	rv = l->l_ops.l_init(lp, &l->l_url, l);

	if (rv == 0) {
		rv = nni_sock_add_listener(s, l);
	}

	if (rv == 0) {
		nni_mtx_lock(&listeners_lk);
		rv = nni_id_alloc32(&listeners, &l->l_id, l);
		nni_mtx_unlock(&listeners_lk);
	}

	if (rv == 0) {
		listener_register_stats(l);
	}

	return (rv);
}